

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VCopyOps(N_Vector w,N_Vector v)

{
  N_Vector_Ops p_Var1;
  N_Vector_Ops p_Var2;
  _func_N_Vector_N_Vector *p_Var3;
  _func_void_N_Vector *p_Var4;
  _func_realtype_ptr_N_Vector *p_Var5;
  _func_void_realtype_ptr_N_Vector *p_Var6;
  _func_sunindextype_N_Vector *p_Var7;
  _func_void_realtype_N_Vector *p_Var8;
  _func_void_N_Vector_N_Vector_N_Vector *p_Var9;
  _func_void_N_Vector_N_Vector *p_Var10;
  _func_void_N_Vector_realtype_N_Vector *p_Var11;
  _func_realtype_N_Vector *p_Var12;
  _func_realtype_N_Vector_N_Vector_N_Vector *p_Var13;
  _func_realtype_N_Vector_N_Vector *p_Var14;
  _func_void_realtype_N_Vector_N_Vector *p_Var15;
  _func_int_N_Vector_N_Vector_N_Vector *p_Var16;
  _func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *p_Var17;
  _func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *p_Var18;
  _func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *p_Var19;
  _func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *p_Var20;
  _func_int_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *p_Var21;
  _func_int_N_Vector_N_Vector *p_Var22;
  _func_int_int_N_Vector_realtype_ptr *p_Var23;
  _func_int_N_Vector_void_ptr *p_Var24;
  int iVar25;
  
  iVar25 = -1;
  if (((v != (N_Vector)0x0 && w != (N_Vector)0x0) && (p_Var1 = w->ops, p_Var1 != (N_Vector_Ops)0x0))
     && (p_Var2 = v->ops, p_Var2 != (N_Vector_Ops)0x0)) {
    p_Var3 = p_Var1->nvclone;
    p_Var2->nvgetvectorid = p_Var1->nvgetvectorid;
    p_Var2->nvclone = p_Var3;
    p_Var4 = p_Var1->nvdestroy;
    p_Var2->nvcloneempty = p_Var1->nvcloneempty;
    p_Var2->nvdestroy = p_Var4;
    p_Var5 = p_Var1->nvgetarraypointer;
    p_Var2->nvspace = p_Var1->nvspace;
    p_Var2->nvgetarraypointer = p_Var5;
    p_Var6 = p_Var1->nvsetarraypointer;
    p_Var2->nvgetdevicearraypointer = p_Var1->nvgetdevicearraypointer;
    p_Var2->nvsetarraypointer = p_Var6;
    p_Var7 = p_Var1->nvgetlength;
    p_Var2->nvgetcommunicator = p_Var1->nvgetcommunicator;
    p_Var2->nvgetlength = p_Var7;
    p_Var8 = p_Var1->nvconst;
    p_Var2->nvlinearsum = p_Var1->nvlinearsum;
    p_Var2->nvconst = p_Var8;
    p_Var9 = p_Var1->nvdiv;
    p_Var2->nvprod = p_Var1->nvprod;
    p_Var2->nvdiv = p_Var9;
    p_Var10 = p_Var1->nvabs;
    p_Var2->nvscale = p_Var1->nvscale;
    p_Var2->nvabs = p_Var10;
    p_Var11 = p_Var1->nvaddconst;
    p_Var2->nvinv = p_Var1->nvinv;
    p_Var2->nvaddconst = p_Var11;
    p_Var12 = p_Var1->nvmaxnorm;
    p_Var2->nvdotprod = p_Var1->nvdotprod;
    p_Var2->nvmaxnorm = p_Var12;
    p_Var13 = p_Var1->nvwrmsnormmask;
    p_Var2->nvwrmsnorm = p_Var1->nvwrmsnorm;
    p_Var2->nvwrmsnormmask = p_Var13;
    p_Var14 = p_Var1->nvwl2norm;
    p_Var2->nvmin = p_Var1->nvmin;
    p_Var2->nvwl2norm = p_Var14;
    p_Var15 = p_Var1->nvcompare;
    p_Var2->nvl1norm = p_Var1->nvl1norm;
    p_Var2->nvcompare = p_Var15;
    p_Var16 = p_Var1->nvconstrmask;
    p_Var2->nvinvtest = p_Var1->nvinvtest;
    p_Var2->nvconstrmask = p_Var16;
    p_Var17 = p_Var1->nvlinearcombination;
    p_Var2->nvminquotient = p_Var1->nvminquotient;
    p_Var2->nvlinearcombination = p_Var17;
    p_Var18 = p_Var1->nvdotprodmulti;
    p_Var2->nvscaleaddmulti = p_Var1->nvscaleaddmulti;
    p_Var2->nvdotprodmulti = p_Var18;
    p_Var19 = p_Var1->nvscalevectorarray;
    p_Var2->nvlinearsumvectorarray = p_Var1->nvlinearsumvectorarray;
    p_Var2->nvscalevectorarray = p_Var19;
    p_Var20 = p_Var1->nvwrmsnormvectorarray;
    p_Var2->nvconstvectorarray = p_Var1->nvconstvectorarray;
    p_Var2->nvwrmsnormvectorarray = p_Var20;
    p_Var21 = p_Var1->nvscaleaddmultivectorarray;
    p_Var2->nvwrmsnormmaskvectorarray = p_Var1->nvwrmsnormmaskvectorarray;
    p_Var2->nvscaleaddmultivectorarray = p_Var21;
    p_Var14 = p_Var1->nvdotprodlocal;
    p_Var2->nvlinearcombinationvectorarray = p_Var1->nvlinearcombinationvectorarray;
    p_Var2->nvdotprodlocal = p_Var14;
    p_Var12 = p_Var1->nvminlocal;
    p_Var2->nvmaxnormlocal = p_Var1->nvmaxnormlocal;
    p_Var2->nvminlocal = p_Var12;
    p_Var22 = p_Var1->nvinvtestlocal;
    p_Var2->nvl1normlocal = p_Var1->nvl1normlocal;
    p_Var2->nvinvtestlocal = p_Var22;
    p_Var14 = p_Var1->nvminquotientlocal;
    p_Var2->nvconstrmasklocal = p_Var1->nvconstrmasklocal;
    p_Var2->nvminquotientlocal = p_Var14;
    p_Var13 = p_Var1->nvwsqrsummasklocal;
    p_Var2->nvwsqrsumlocal = p_Var1->nvwsqrsumlocal;
    p_Var2->nvwsqrsummasklocal = p_Var13;
    p_Var23 = p_Var1->nvdotprodmultiallreduce;
    p_Var2->nvdotprodmultilocal = p_Var1->nvdotprodmultilocal;
    p_Var2->nvdotprodmultiallreduce = p_Var23;
    p_Var24 = p_Var1->nvbufpack;
    p_Var2->nvbufsize = p_Var1->nvbufsize;
    p_Var2->nvbufpack = p_Var24;
    p_Var4 = p_Var1->nvprint;
    p_Var2->nvbufunpack = p_Var1->nvbufunpack;
    p_Var2->nvprint = p_Var4;
    p_Var2->nvprintfile = p_Var1->nvprintfile;
    iVar25 = 0;
  }
  return iVar25;
}

Assistant:

int N_VCopyOps(N_Vector w, N_Vector v)
{
  /* Check that ops structures exist */
  if (w == NULL || v == NULL) return(-1);
  if (w->ops == NULL || v->ops == NULL) return(-1);

  /* Copy ops from w to v */

  /*
   * REQUIRED operations.
   *
   * These must be implemented by derivations of the generic N_Vector.
   */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid           = w->ops->nvgetvectorid;
  v->ops->nvclone                 = w->ops->nvclone;
  v->ops->nvcloneempty            = w->ops->nvcloneempty;
  v->ops->nvdestroy               = w->ops->nvdestroy;
  v->ops->nvspace                 = w->ops->nvspace;
  v->ops->nvgetarraypointer       = w->ops->nvgetarraypointer;
  v->ops->nvgetdevicearraypointer = w->ops->nvgetdevicearraypointer;
  v->ops->nvsetarraypointer       = w->ops->nvsetarraypointer;
  v->ops->nvgetcommunicator       = w->ops->nvgetcommunicator;
  v->ops->nvgetlength             = w->ops->nvgetlength;

  /* standard vector operations */
  v->ops->nvlinearsum    = w->ops->nvlinearsum;
  v->ops->nvconst        = w->ops->nvconst;
  v->ops->nvprod         = w->ops->nvprod;
  v->ops->nvdiv          = w->ops->nvdiv;
  v->ops->nvscale        = w->ops->nvscale;
  v->ops->nvabs          = w->ops->nvabs;
  v->ops->nvinv          = w->ops->nvinv;
  v->ops->nvaddconst     = w->ops->nvaddconst;
  v->ops->nvdotprod      = w->ops->nvdotprod;
  v->ops->nvmaxnorm      = w->ops->nvmaxnorm;
  v->ops->nvwrmsnorm     = w->ops->nvwrmsnorm;
  v->ops->nvwrmsnormmask = w->ops->nvwrmsnormmask;
  v->ops->nvmin          = w->ops->nvmin;
  v->ops->nvwl2norm      = w->ops->nvwl2norm;
  v->ops->nvl1norm       = w->ops->nvl1norm;
  v->ops->nvcompare      = w->ops->nvcompare;
  v->ops->nvinvtest      = w->ops->nvinvtest;
  v->ops->nvconstrmask   = w->ops->nvconstrmask;
  v->ops->nvminquotient  = w->ops->nvminquotient;

  /*
   * OPTIONAL operations.
   *
   * These operations provide default implementations that may be overriden.
   */

  /* fused vector operations */
  v->ops->nvlinearcombination = w->ops->nvlinearcombination;
  v->ops->nvscaleaddmulti     = w->ops->nvscaleaddmulti;
  v->ops->nvdotprodmulti      = w->ops->nvdotprodmulti;

  /* vector array operations */
  v->ops->nvlinearsumvectorarray         = w->ops->nvlinearsumvectorarray;
  v->ops->nvscalevectorarray             = w->ops->nvscalevectorarray;
  v->ops->nvconstvectorarray             = w->ops->nvconstvectorarray;
  v->ops->nvwrmsnormvectorarray          = w->ops->nvwrmsnormvectorarray;
  v->ops->nvwrmsnormmaskvectorarray      = w->ops->nvwrmsnormmaskvectorarray;
  v->ops->nvscaleaddmultivectorarray     = w->ops->nvscaleaddmultivectorarray;
  v->ops->nvlinearcombinationvectorarray = w->ops->nvlinearcombinationvectorarray;

  /*
   * OPTIONAL operations with no default implementation.
   */

  /* local reduction operations */
  v->ops->nvdotprodlocal      = w->ops->nvdotprodlocal;
  v->ops->nvmaxnormlocal      = w->ops->nvmaxnormlocal;
  v->ops->nvminlocal          = w->ops->nvminlocal;
  v->ops->nvl1normlocal       = w->ops->nvl1normlocal;
  v->ops->nvinvtestlocal      = w->ops->nvinvtestlocal;
  v->ops->nvconstrmasklocal   = w->ops->nvconstrmasklocal;
  v->ops->nvminquotientlocal  = w->ops->nvminquotientlocal;
  v->ops->nvwsqrsumlocal      = w->ops->nvwsqrsumlocal;
  v->ops->nvwsqrsummasklocal  = w->ops->nvwsqrsummasklocal;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal     = w->ops->nvdotprodmultilocal;
  v->ops->nvdotprodmultiallreduce = w->ops->nvdotprodmultiallreduce;

  /* XBraid interface operations */
  v->ops->nvbufsize   = w->ops->nvbufsize;
  v->ops->nvbufpack   = w->ops->nvbufpack;
  v->ops->nvbufunpack = w->ops->nvbufunpack;

  /* debugging functions  */
  v->ops->nvprint     = w->ops->nvprint;
  v->ops->nvprintfile = w->ops->nvprintfile;

  return(0);
}